

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3SelectAddColumnTypeAndCollation(Parse *pParse,Table *pTab,Select *pSelect)

{
  sqlite3 *db;
  ExprList *pEVar1;
  Column *pCVar2;
  Expr *pExpr;
  char *z;
  char cVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  void *pvVar7;
  CollSeq *pCVar8;
  long lVar9;
  long lVar10;
  NameContext sNC;
  NameContext local_68;
  
  db = pParse->db;
  if (db->mallocFailed != '\0') {
    return;
  }
  local_68.nRef = 0;
  local_68.nErr = 0;
  local_68.ncFlags = 0;
  local_68._42_6_ = 0;
  local_68.pWinSelect = (Select *)0x0;
  local_68.uNC.pEList = (ExprList *)0x0;
  local_68.pNext = (NameContext *)0x0;
  local_68.pParse = (Parse *)0x0;
  local_68.pSrcList = pSelect->pSrc;
  pEVar1 = pSelect->pEList;
  pCVar2 = pTab->aCol;
  lVar10 = 0;
  for (lVar9 = 0; lVar9 < pTab->nCol; lVar9 = lVar9 + 1) {
    pExpr = *(Expr **)((long)&pEVar1->a[0].pExpr + lVar10);
    pcVar6 = columnTypeImpl(&local_68,pExpr);
    cVar3 = sqlite3ExprAffinity(pExpr);
    (&pCVar2->affinity)[lVar10] = cVar3;
    if (pcVar6 != (char *)0x0) {
      iVar4 = sqlite3Strlen30(pcVar6);
      z = *(char **)((long)&pCVar2->zName + lVar10);
      uVar5 = sqlite3Strlen30(z);
      pvVar7 = sqlite3DbReallocOrFree(db,z,(ulong)(iVar4 + uVar5 + 2));
      *(void **)((long)&pCVar2->zName + lVar10) = pvVar7;
      if (pvVar7 != (void *)0x0) {
        memcpy((void *)((long)pvVar7 + (ulong)uVar5 + 1),pcVar6,(ulong)(iVar4 + 1));
        (&pCVar2->colFlags)[lVar10] = (&pCVar2->colFlags)[lVar10] | 4;
      }
      cVar3 = (&pCVar2->affinity)[lVar10];
    }
    if (cVar3 == '\0') {
      (&pCVar2->affinity)[lVar10] = 'A';
    }
    pCVar8 = sqlite3ExprCollSeq(pParse,pExpr);
    if ((pCVar8 != (CollSeq *)0x0) && (*(long *)((long)&pCVar2->zColl + lVar10) == 0)) {
      pcVar6 = sqlite3DbStrDup(db,pCVar8->zName);
      *(char **)((long)&pCVar2->zColl + lVar10) = pcVar6;
    }
    lVar10 = lVar10 + 0x20;
  }
  pTab->szTabRow = 1;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SelectAddColumnTypeAndCollation(
  Parse *pParse,        /* Parsing contexts */
  Table *pTab,          /* Add column type information to this table */
  Select *pSelect       /* SELECT used to determine types and collations */
){
  sqlite3 *db = pParse->db;
  NameContext sNC;
  Column *pCol;
  CollSeq *pColl;
  int i;
  Expr *p;
  struct ExprList_item *a;

  assert( pSelect!=0 );
  assert( (pSelect->selFlags & SF_Resolved)!=0 );
  assert( pTab->nCol==pSelect->pEList->nExpr || db->mallocFailed );
  if( db->mallocFailed ) return;
  memset(&sNC, 0, sizeof(sNC));
  sNC.pSrcList = pSelect->pSrc;
  a = pSelect->pEList->a;
  for(i=0, pCol=pTab->aCol; i<pTab->nCol; i++, pCol++){
    const char *zType;
    int n, m;
    p = a[i].pExpr;
    zType = columnType(&sNC, p, 0, 0, 0);
    /* pCol->szEst = ... // Column size est for SELECT tables never used */
    pCol->affinity = sqlite3ExprAffinity(p);
    if( zType ){
      m = sqlite3Strlen30(zType);
      n = sqlite3Strlen30(pCol->zName);
      pCol->zName = sqlite3DbReallocOrFree(db, pCol->zName, n+m+2);
      if( pCol->zName ){
        memcpy(&pCol->zName[n+1], zType, m+1);
        pCol->colFlags |= COLFLAG_HASTYPE;
      }
    }
    if( pCol->affinity==0 ) pCol->affinity = SQLITE_AFF_BLOB;
    pColl = sqlite3ExprCollSeq(pParse, p);
    if( pColl && pCol->zColl==0 ){
      pCol->zColl = sqlite3DbStrDup(db, pColl->zName);
    }
  }
  pTab->szTabRow = 1; /* Any non-zero value works */
}